

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded-buffer.c
# Opt level: O0

void * supplier(void *tsd)

{
  uint uVar1;
  bounded_buffer_t *bb_00;
  long lVar2;
  int iVar3;
  entry_t *item;
  entry_t *new_entry;
  int i;
  int my_id;
  bb_options_t *options;
  bounded_buffer_t *bb;
  bb_tsd_t *bb_tsd;
  void *tsd_local;
  
  bb_00 = *(bounded_buffer_t **)((long)tsd + 8);
  lVar2 = *tsd;
  uVar1 = *(uint *)((long)tsd + 0x10);
  iVar3 = *(int *)(lVar2 + 0x10);
  fprintf(_stderr,
          "\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0msupplier { id: %d, state : \"running\", gen: %d }\n\n"
          ,"supplier",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bounded-buffer.c"
          ,0x29,(ulong)uVar1,iVar3);
  for (new_entry._0_4_ = 0; (int)new_entry < *(int *)(lVar2 + 0x10);
      new_entry._0_4_ = (int)new_entry + 1) {
    iVar3 = rand();
    millisecond_sleep((long)(iVar3 % *(int *)(lVar2 + 8)));
    item = (entry_t *)malloc(4);
    item->value = uVar1 * *(int *)(lVar2 + 0x10) + (int)new_entry;
    bounded_buffer_put(bb_00,item);
    iVar3 = item->value;
    fprintf(_stderr,"\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0msupplier { id: %d,  entry: %d }\n\n",
            "supplier",
            "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bounded-buffer.c"
            ,0x30,(ulong)uVar1,iVar3);
    bounded_buffer_print_info(bb_00);
  }
  fprintf(_stderr,"\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0msupplier { id: %d, state: \"exit\" }\n\n",
          "supplier",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bounded-buffer.c"
          ,0x33,(ulong)uVar1,iVar3);
  pthread_exit((void *)0x0);
}

Assistant:

void* supplier(void *tsd)
{
    bb_tsd_t* bb_tsd = (bb_tsd_t*) tsd;
    bounded_buffer_t* bb = bb_tsd->bb;
    bb_options_t* options = bb_tsd->options;
    int my_id = bb_tsd->id;

    lwlog_info("supplier { id: %d, state : \"running\", gen: %d }\n", my_id, options->gen_count);
    for (int i=0; i < options->gen_count; i++)
    {
        millisecond_sleep( rand() % options->supplier_max_delay_ms);
        entry_t* new_entry = (entry_t*) malloc(sizeof(entry_t));
        new_entry->value = my_id * options->gen_count + i;
        bounded_buffer_put(bb, new_entry);
        lwlog_info("supplier { id: %d,  entry: %d }\n", my_id, new_entry->value);
        bounded_buffer_print_info(bb);
    }
    lwlog_info("supplier { id: %d, state: \"exit\" }\n", my_id);
    pthread_exit(NULL);
}